

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O0

double enorm(double *x,int N)

{
  double dVar1;
  double zero;
  double x3max;
  double x1max;
  double xabs;
  double s3;
  double s2;
  double s1;
  double rgiant;
  double rdwarf;
  double one;
  double floatn;
  double agiant;
  double dStack_20;
  int i;
  double enrm;
  int N_local;
  double *x_local;
  
  zero = 0.0;
  x3max = 0.0;
  xabs = 0.0;
  s3 = 0.0;
  s2 = 0.0;
  for (agiant._4_4_ = 0; agiant._4_4_ < N; agiant._4_4_ = agiant._4_4_ + 1) {
    dVar1 = ABS(x[agiant._4_4_]);
    if (dVar1 < 1.304e+19 / (double)N) {
      if (3.834e-20 < dVar1) {
        s3 = dVar1 * dVar1 + s3;
      }
      else if (dVar1 <= zero) {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          xabs = (dVar1 / zero) * (dVar1 / zero) + xabs;
        }
      }
      else {
        xabs = xabs * (zero / dVar1) * (zero / dVar1) + 1.0;
        zero = dVar1;
      }
    }
    else if (dVar1 <= x3max) {
      s2 = (dVar1 / x3max) * (dVar1 / x3max) + s2;
    }
    else {
      s2 = s2 * (x3max / dVar1) * (x3max / dVar1) + 1.0;
      x3max = dVar1;
    }
  }
  if ((s2 != 0.0) || (NAN(s2))) {
    dStack_20 = sqrt(s2 + (s3 / x3max) / x3max);
    dStack_20 = x3max * dStack_20;
  }
  else if ((s3 != 0.0) || (NAN(s3))) {
    if (zero <= s3) {
      dStack_20 = sqrt(s3 * ((zero / s3) * zero * xabs + 1.0));
    }
    else {
      dStack_20 = sqrt(zero * (zero * xabs + s3 / zero));
    }
  }
  else {
    dStack_20 = sqrt(xabs);
    dStack_20 = zero * dStack_20;
  }
  return dStack_20;
}

Assistant:

double enorm(double *x, int N) {
	double enrm;
	int i;
    double agiant,floatn,one,rdwarf,rgiant,s1,s2,s3,xabs,x1max,x3max,zero;

	/*
	 * C Translation of Fortran Code
	 * Argonne national laboratory. minpack project. march 1980.
      burton s. garbow, kenneth e. hillstrom, jorge j. more
	 */

    one = 1.0;
    zero = 0.0;
    rdwarf = 3.834e-20;
    rgiant = 1.304e19;
    s1 = s2 = s3 = x1max = x3max = zero;
    floatn = N;
    agiant = rgiant / floatn;

    for(i = 0; i < N;++i) {
    	xabs = fabs(x[i]);
    	if (xabs >= agiant) {
    		//sum for large components
    		if (xabs > x1max) {
    			s1 = one + s1*(x1max/xabs)*(x1max/xabs);
    			x1max = xabs;
    		} else {
    			s1 = s1 + (xabs/x1max)*(xabs/x1max);
    		}
    	} else if (xabs <= rdwarf) {
    		//sum for small components
    		if (xabs > x3max) {
                s3 = one + s3*(x3max/xabs)*(x3max/xabs);
                x3max = xabs;
    		} else {
    			if (xabs != zero) {
    				s3 = s3 + (xabs/x3max)*(xabs/x3max);
    			}
    		}

    	} else {
    		//sum for intermediate components.
    		s2 += xabs*xabs;
    	}
    }

    if (s1 != zero) {
    	enrm = x1max*sqrt(s1+(s2/x1max)/x1max);
    } else {
    	if (s2 != zero) {
    		if (s2 >= x3max) {
    			enrm = sqrt(s2*(one+(x3max/s2)*(x3max*s3)));
    		}
    		if (s2 < x3max) {
    			enrm = sqrt(x3max*((s2/x3max)+(x3max*s3)));
    		}
    	} else {
    		enrm = x3max*sqrt(s3);
    	}
    }

	return enrm;
}